

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

Builder * __thiscall
capnp::_::PointerBuilder::getBlob<capnp::Text>
          (Builder *__return_storage_ptr__,PointerBuilder *this,void *defaultValue,
          ByteCount defaultSize)

{
  word *pwVar1;
  BuilderArena *this_00;
  uint uVar2;
  SegmentBuilder *this_01;
  ulong uVar3;
  WirePointer *pWVar4;
  WirePointer *pWVar5;
  WirePointer *ref;
  uint uVar6;
  AllocateResult AVar7;
  Fault f;
  ThrowOverflow local_49;
  Fault local_48;
  void *local_40;
  CapTableBuilder *local_38;
  
  ref = this->pointer;
  this_01 = this->segment;
  local_38 = this->capTable;
  uVar2 = assertMax<536870910u,unsigned_int,kj::ThrowOverflow>(defaultSize,&local_49);
  uVar6 = (ref->offsetAndKind).value;
  if ((ref->field_1).structRef != (StructRef)0x0 || uVar6 != 0) {
    if ((uVar6 & 3) == 2) {
      local_40 = defaultValue;
      this_01 = BuilderArena::getSegment
                          ((BuilderArena *)(this_01->super_SegmentReader).arena,
                           (SegmentId)(ref->field_1).structRef);
      uVar6 = (ref->offsetAndKind).value;
      pwVar1 = (this_01->super_SegmentReader).ptr.ptr;
      uVar3 = (ulong)(uVar6 & 0xfffffff8);
      pWVar4 = (WirePointer *)((long)&pwVar1->content + uVar3);
      ref = (WirePointer *)((long)&pwVar1[1].content + uVar3);
      if ((uVar6 & 4) == 0) {
        pWVar5 = ref + ((int)(pWVar4->offsetAndKind).value >> 2);
        defaultValue = local_40;
        ref = pWVar4;
      }
      else {
        this_01 = BuilderArena::getSegment
                            ((BuilderArena *)(this_01->super_SegmentReader).arena,
                             (SegmentId)(pWVar4->field_1).structRef);
        pWVar5 = (WirePointer *)
                 ((long)&((this_01->super_SegmentReader).ptr.ptr)->content +
                 (ulong)((pWVar4->offsetAndKind).value & 0xfffffff8));
        defaultValue = local_40;
      }
    }
    else {
      pWVar5 = ref + (long)((int)uVar6 >> 2) + 1;
    }
    if (this_01->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_01);
    }
    if (((ref->offsetAndKind).value & 3) == 1) {
      uVar6 = (ref->field_1).upper32Bits;
      if ((uVar6 & 7) == 2) {
        if (uVar6 < 8) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                    (&local_48,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x689,FAILED,(char *)0x0,
                     "\"zero-size blob can\'t be text (need NUL terminator)\"",
                     (char (*) [51])"zero-size blob can\'t be text (need NUL terminator)");
        }
        else {
          uVar3 = (ulong)((uVar6 >> 3) - 1);
          if (*(char *)((long)&(pWVar5->offsetAndKind).value + uVar3) == '\0') {
            (__return_storage_ptr__->content).ptr = (char *)pWVar5;
            (__return_storage_ptr__->content).size_ = uVar3 + 1;
            return __return_storage_ptr__;
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
                    (&local_48,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x683,FAILED,"*(bptr + *size) == \'\\0\'",
                     "\"Text blob missing NUL terminator.\"",
                     (char (*) [34])"Text blob missing NUL terminator.");
        }
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[77]>
                  (&local_48,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x67c,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                   "\"Called getText{Field,Element}() but existing list pointer is not byte-sized.\""
                   ,(char (*) [77])
                    "Called getText{Field,Element}() but existing list pointer is not byte-sized.");
      }
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[68]>
                (&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x678,FAILED,"ref->kind() == WirePointer::LIST",
                 "\"Called getText{Field,Element}() but existing pointer is not a list.\"",
                 (char (*) [68])
                 "Called getText{Field,Element}() but existing pointer is not a list.");
    }
    kj::_::Debug::Fault::~Fault(&local_48);
  }
  if (uVar2 == 0) {
    (__return_storage_ptr__->content).ptr = &Text::Builder::nulstr;
    (__return_storage_ptr__->content).size_ = 1;
  }
  else {
    uVar6 = uVar2 + 8 >> 3;
    if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
      WireHelpers::zeroObject(this_01,local_38,ref);
    }
    pWVar5 = (WirePointer *)this_01->pos;
    if (((long)((long)(this_01->super_SegmentReader).ptr.ptr +
               ((this_01->super_SegmentReader).ptr.size_ * 8 - (long)pWVar5)) >> 3 <
         (long)(ulong)uVar6) ||
       (this_01->pos = (word *)(pWVar5 + uVar6), pWVar5 == (WirePointer *)0x0)) {
      this_00 = (BuilderArena *)(this_01->super_SegmentReader).arena;
      uVar6 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                        (uVar6 + 1,(anon_class_1_0_00000001 *)&local_48);
      AVar7 = BuilderArena::allocate(this_00,uVar6);
      pWVar4 = (WirePointer *)AVar7.words;
      (ref->offsetAndKind).value =
           (int)AVar7.words - *(int *)&((AVar7.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U
           | 2;
      ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                     ((AVar7.segment)->super_SegmentReader).id.value;
      (pWVar4->offsetAndKind).value = 1;
      pWVar5 = pWVar4 + 1;
    }
    else {
      (ref->offsetAndKind).value = ((uint)((ulong)((long)pWVar5 - (long)ref) >> 1) & 0xfffffffc) - 3
      ;
      pWVar4 = ref;
    }
    (pWVar4->field_1).upper32Bits = uVar2 * 8 + 10;
    (__return_storage_ptr__->content).ptr = (char *)pWVar5;
    (__return_storage_ptr__->content).size_ = (ulong)uVar2 + 1;
    memcpy(pWVar5,defaultValue,(ulong)uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Text::Builder PointerBuilder::getBlob<Text>(const void* defaultValue, ByteCount defaultSize) {
  return WireHelpers::getWritableTextPointer(pointer, segment, capTable, defaultValue,
      assertMax<MAX_TEXT_SIZE>(defaultSize, ThrowOverflow()));
}